

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::EnumVal::Deserialize(EnumVal *this,Parser *parser,EnumVal *val)

{
  bool bVar1;
  String *this_00;
  int64_t iVar2;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  string local_40;
  
  this_00 = reflection::EnumVal::name(val);
  String::str_abi_cxx11_(&local_40,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar2 = reflection::EnumVal::value(val);
  this->value = iVar2;
  type = reflection::EnumVal::union_type(val);
  bVar1 = Type::Deserialize(&this->union_type,parser,type);
  if (bVar1) {
    attrs = reflection::EnumVal::attributes(val);
    bVar1 = DeserializeAttributesCommon(&this->attributes,parser,attrs);
    if (bVar1) {
      documentation = reflection::EnumVal::documentation(val);
      anon_unknown_0::DeserializeDoc(&this->doc_comment,documentation);
      return true;
    }
  }
  return false;
}

Assistant:

bool EnumVal::Deserialize(Parser &parser, const reflection::EnumVal *val) {
  name = val->name()->str();
  value = val->value();
  if (!union_type.Deserialize(parser, val->union_type())) return false;
  if (!DeserializeAttributes(parser, val->attributes())) return false;
  DeserializeDoc(doc_comment, val->documentation());
  return true;
}